

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::CoverpointSyntax::setChild(CoverpointSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar2;
  NamedLabelSyntax *pNVar3;
  SyntaxNode *pSVar4;
  SyntaxList<slang::syntax::MemberSyntax> *pSVar5;
  CoverageIffClauseSyntax *pCVar6;
  logic_error *this_00;
  Token TVar7;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 10) {
    switch(index) {
    case 0:
      pSVar4 = TokenOrSyntax::node(&child);
      pSVar2 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (pSVar4);
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar2->super_SyntaxListBase).childCount;
      sVar1 = (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 1:
      pSVar4 = TokenOrSyntax::node(&child);
      if (pSVar4 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar4 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::DataTypeSyntax>(pSVar4);
      }
      not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
                ((not_null<slang::syntax::DataTypeSyntax*> *)&local_b8,(DataTypeSyntax **)&local_d8)
      ;
      (this->type).ptr = (DataTypeSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 2:
      pSVar4 = TokenOrSyntax::node(&child);
      if (pSVar4 == (SyntaxNode *)0x0) {
        pNVar3 = (NamedLabelSyntax *)0x0;
      }
      else {
        pSVar4 = TokenOrSyntax::node(&child);
        pNVar3 = SyntaxNode::as<slang::syntax::NamedLabelSyntax>(pSVar4);
      }
      this->label = pNVar3;
      break;
    case 3:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->coverpoint).kind = TVar7.kind;
      (this->coverpoint).field_0x2 = TVar7._2_1_;
      (this->coverpoint).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->coverpoint).rawLen = TVar7.rawLen;
      (this->coverpoint).info = TVar7.info;
      break;
    case 4:
      pSVar4 = TokenOrSyntax::node(&child);
      if (pSVar4 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar4 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar4)
        ;
      }
      not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
                ((not_null<slang::syntax::ExpressionSyntax*> *)&local_b8,
                 (ExpressionSyntax **)&local_d8);
      (this->expr).ptr = (ExpressionSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 5:
      pSVar4 = TokenOrSyntax::node(&child);
      if (pSVar4 == (SyntaxNode *)0x0) {
        pCVar6 = (CoverageIffClauseSyntax *)0x0;
      }
      else {
        pSVar4 = TokenOrSyntax::node(&child);
        pCVar6 = SyntaxNode::as<slang::syntax::CoverageIffClauseSyntax>(pSVar4);
      }
      this->iff = pCVar6;
      break;
    case 6:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->openBrace).kind = TVar7.kind;
      (this->openBrace).field_0x2 = TVar7._2_1_;
      (this->openBrace).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->openBrace).rawLen = TVar7.rawLen;
      (this->openBrace).info = TVar7.info;
      break;
    case 7:
      pSVar4 = TokenOrSyntax::node(&child);
      pSVar5 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::MemberSyntax>>(pSVar4);
      (this->members).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar5->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->members).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar5->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->members).super_SyntaxListBase.childCount = (pSVar5->super_SyntaxListBase).childCount;
      sVar1 = (pSVar5->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
      (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar5->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
      (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ =
           sVar1;
      break;
    case 8:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->closeBrace).kind = TVar7.kind;
      (this->closeBrace).field_0x2 = TVar7._2_1_;
      (this->closeBrace).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->closeBrace).rawLen = TVar7.rawLen;
      (this->closeBrace).info = TVar7.info;
      break;
    case 9:
      TVar7 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->emptySemi).kind = TVar7.kind;
      (this->emptySemi).field_0x2 = TVar7._2_1_;
      (this->emptySemi).numFlags = (NumericTokenFlags)TVar7.numFlags.raw;
      (this->emptySemi).rawLen = TVar7.rawLen;
      (this->emptySemi).info = TVar7.info;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0xdb4);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void CoverpointSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 2: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 3: coverpoint = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 5: iff = child.node() ? &child.node()->as<CoverageIffClauseSyntax>() : nullptr; return;
        case 6: openBrace = child.token(); return;
        case 7: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 8: closeBrace = child.token(); return;
        case 9: emptySemi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}